

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

void lest::report(ostream *os,message *e,string *test)

{
  ostream *poVar1;
  char *pcVar2;
  comment cStack_68;
  location local_48;
  
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)&e->kind);
  std::__cxx11::string::string((string *)&cStack_68,(string *)&e->note);
  poVar1 = operator<<(poVar1,&cStack_68);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&cStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, std::string test )
{
    os << e.where << ": " << e.kind << e.note << ": " << test << ": " << e.what() << std::endl;
}